

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  short sVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  uint uVar10;
  ImGuiWindow **ppIVar11;
  ImGuiWindow *pIVar12;
  byte bVar13;
  int iVar14;
  byte bVar15;
  bool bVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  byte bVar20;
  ulong uVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow *pIVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  ImGuiWindow *local_80;
  ImGuiViewportP *local_70;
  ImRect local_68;
  ImVec2 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  pIVar8 = GImGui;
  pIVar23 = GImGui->MovingWindow;
  if (pIVar23 == (ImGuiWindow *)0x0) {
    local_70 = (ImGuiViewportP *)0x0;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
    local_70 = pIVar23->Viewport;
    pIVar23->Viewport = GImGui->MouseViewport;
    pIVar22 = (ImGuiWindow *)0x0;
    if ((pIVar23->Flags & 0x200) == 0) {
      pIVar22 = pIVar23;
    }
  }
  local_58 = (pIVar8->Style).TouchExtraPadding;
  local_48._8_8_ = 0;
  local_48._0_4_ = local_58.x;
  local_48._4_4_ = local_58.y;
  if ((pIVar8->IO).ConfigWindowsResizeFromEdges == true) {
    auVar25 = maxps(local_48,_DAT_002145d0);
    local_58 = auVar25._0_8_;
  }
  uStack_50 = 0;
  p = &(pIVar8->IO).MousePos;
  local_80 = (ImGuiWindow *)0x0;
  iVar14 = (pIVar8->Windows).Size;
  do {
    do {
      do {
        iVar19 = iVar14;
        if (iVar19 < 1) {
          pIVar8->HoveredWindow = pIVar22;
          if (pIVar22 == (ImGuiWindow *)0x0) {
            pIVar22 = (ImGuiWindow *)0x0;
            pIVar23 = (ImGuiWindow *)0x0;
          }
          else {
LAB_001e25cb:
            pIVar23 = pIVar22->RootWindow;
          }
          pIVar8->HoveredRootWindow = pIVar23;
          pIVar8->HoveredWindowUnderMovingWindow = local_80;
          pIVar12 = pIVar8->MovingWindow;
          if (pIVar12 != (ImGuiWindow *)0x0) {
            pIVar12->Viewport = local_70;
          }
          if ((pIVar22 != pIVar12 && pIVar22 != (ImGuiWindow *)0x0) &&
             (pIVar22->Viewport != pIVar8->MouseViewport)) {
            __assert_fail("g.HoveredWindow == __null || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                          ,0xee5,"void ImGui::UpdateHoveredWindowAndCaptureFlags()");
          }
          ppIVar11 = &pIVar8->HoveredWindow;
          pIVar12 = GetTopMostPopupModal();
          if (((pIVar12 != (ImGuiWindow *)0x0) && (pIVar23 != (ImGuiWindow *)0x0)) &&
             (bVar9 = IsWindowChildOf(pIVar23,pIVar12), !bVar9)) {
            *ppIVar11 = (ImGuiWindow *)0x0;
            pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
            pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
            pIVar22 = (ImGuiWindow *)0x0;
          }
          uVar10 = (pIVar8->IO).ConfigFlags;
          if ((uVar10 & 0x10) != 0) {
            *ppIVar11 = (ImGuiWindow *)0x0;
            pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
            pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
            pIVar22 = (ImGuiWindow *)0x0;
          }
          uVar18 = 0xffffffffffffffff;
          uVar21 = 0;
          bVar13 = 0;
          while( true ) {
            iVar14 = (int)uVar18;
            if (uVar21 == 5) break;
            if ((pIVar8->IO).MouseClicked[uVar21] == true) {
              bVar9 = true;
              if (pIVar22 == (ImGuiWindow *)0x0) {
                bVar9 = 0 < (pIVar8->OpenPopupStack).Size;
              }
              (pIVar8->IO).MouseDownOwned[uVar21] = bVar9;
            }
            bVar9 = (pIVar8->IO).MouseDown[uVar21];
            if ((bVar9 == true) &&
               ((iVar14 == -1 ||
                (dVar2 = (pIVar8->IO).MouseClickedTime[iVar14],
                pdVar1 = (pIVar8->IO).MouseClickedTime + uVar21,
                *pdVar1 <= dVar2 && dVar2 != *pdVar1)))) {
              uVar18 = uVar21 & 0xffffffff;
            }
            bVar13 = bVar13 & 1 | bVar9;
            uVar21 = uVar21 + 1;
          }
          if (iVar14 == -1) {
            bVar15 = 1;
          }
          else {
            bVar15 = (pIVar8->IO).MouseDownOwned[iVar14];
          }
          if (pIVar8->DragDropActive == true) {
            bVar20 = ((byte)pIVar8->DragDropSourceFlags & 0x10) >> 4;
          }
          else {
            bVar20 = 0;
          }
          if (bVar20 == 0 && (bVar15 & 1) == 0) {
            *ppIVar11 = (ImGuiWindow *)0x0;
            pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
            pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
            pIVar22 = (ImGuiWindow *)0x0;
          }
          if (pIVar8->WantCaptureMouseNextFrame == -1) {
            bVar9 = true;
            if ((bVar15 & (pIVar22 != (ImGuiWindow *)0x0 | bVar13)) == 0) {
              bVar9 = 0 < (pIVar8->OpenPopupStack).Size;
            }
            (pIVar8->IO).WantCaptureMouse = bVar9;
          }
          else {
            (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
          }
          if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
            bVar9 = pIVar8->ActiveId != 0 || pIVar12 != (ImGuiWindow *)0x0;
          }
          else {
            bVar9 = pIVar8->WantCaptureKeyboardNextFrame != 0;
          }
          bVar16 = true;
          if ((pIVar8->IO).NavActive == false) {
            bVar16 = bVar9;
          }
          if ((uVar10 & 9) != 1) {
            bVar16 = bVar9;
          }
          (pIVar8->IO).WantCaptureKeyboard = bVar16;
          (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
          return;
        }
        iVar14 = iVar19 + -1;
        ppIVar11 = ImVector<ImGuiWindow_*>::operator[](&pIVar8->Windows,iVar14);
        pIVar23 = *ppIVar11;
      } while (((pIVar23->Active != true) || (pIVar23->Hidden != false)) ||
              ((pIVar23->Flags & 0x200) != 0));
      if (pIVar23->Viewport == (ImGuiViewportP *)0x0) {
        __assert_fail("window->Viewport",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                      ,0x1220,"void FindHoveredWindow()");
      }
    } while (pIVar23->Viewport != pIVar8->MouseViewport);
    IVar6 = (pIVar23->OuterRectClipped).Min;
    IVar7 = (pIVar23->OuterRectClipped).Max;
    uVar10 = (uint)((pIVar23->Flags & 0x1000042U) == 0);
    auVar26._0_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
    auVar26._4_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
    auVar26._8_8_ = 0;
    auVar25._8_8_ = uStack_50;
    auVar25._0_4_ = local_58.x;
    auVar25._4_4_ = local_58.y;
    auVar27 = ~auVar26 & local_48 | auVar25 & auVar26;
    fVar28 = auVar27._0_4_;
    fVar24 = auVar27._4_4_;
    auVar4._4_8_ = SUB168(auVar25 & auVar26,8);
    auVar4._0_4_ = fVar24;
    auVar27._0_8_ = auVar4._0_8_ << 0x20;
    auVar27._8_4_ = fVar28;
    auVar27._12_4_ = fVar24;
    local_68.Min.x = IVar6.x;
    local_68.Min.y = IVar6.y;
    local_68.Max.x = IVar7.x;
    local_68.Max.y = IVar7.y;
    auVar5._4_8_ = auVar27._8_8_;
    auVar5._0_4_ = fVar24 + local_68.Min.y;
    auVar29._0_8_ = auVar5._0_8_ << 0x20;
    auVar29._8_4_ = fVar28 + local_68.Max.x;
    auVar29._12_4_ = fVar24 + local_68.Max.y;
    local_68.Max = auVar29._8_8_;
    local_68.Min.y = local_68.Min.y - fVar24;
    local_68.Min.x = local_68.Min.x - fVar28;
    bVar9 = ImRect::Contains(&local_68,p);
    if (bVar9) {
      sVar3 = (pIVar23->HitTestHoleSize).x;
      if (sVar3 != 0) {
        iVar14 = (int)(pIVar23->HitTestHoleOffset).x;
        fVar28 = p->x - (pIVar23->Pos).x;
        if ((float)iVar14 <= fVar28) {
          iVar17 = (int)(pIVar23->HitTestHoleOffset).y;
          fVar24 = (pIVar8->IO).MousePos.y - (pIVar23->Pos).y;
          if ((((float)iVar17 <= fVar24) && (fVar28 < (float)(iVar14 + sVar3))) &&
             (fVar24 < (float)((pIVar23->HitTestHoleSize).y + iVar17))) goto LAB_001e253b;
        }
      }
      if (pIVar22 == (ImGuiWindow *)0x0) {
        pIVar22 = pIVar23;
      }
      if (((local_80 == (ImGuiWindow *)0x0) &&
          (local_80 = pIVar23, pIVar8->MovingWindow != (ImGuiWindow *)0x0)) &&
         (pIVar23->RootWindow == pIVar8->MovingWindow->RootWindow)) {
        local_80 = (ImGuiWindow *)0x0;
      }
      else {
        if (pIVar22 != (ImGuiWindow *)0x0) {
          pIVar8->HoveredWindow = pIVar22;
          goto LAB_001e25cb;
        }
        pIVar22 = (ImGuiWindow *)0x0;
      }
    }
LAB_001e253b:
    iVar14 = iVar19 + -1;
  } while( true );
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}